

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

WeakRefDictionaryEntry<Js::DynamicType,_Memory::WriteBarrierPtr<Js::DynamicType>_> * __thiscall
Memory::
AllocateArray<Memory::Recycler,JsUtil::WeakRefDictionaryEntry<Js::DynamicType,Memory::WriteBarrierPtr<Js::DynamicType>>,false>
          (Memory *this,Recycler *allocator,offset_in_Recycler_to_subr AllocFunc,size_t count)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  WeakRefDictionaryEntry<Js::DynamicType,_Memory::WriteBarrierPtr<Js::DynamicType>_> *pWVar3;
  long lVar4;
  size_t byteSize;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pWVar3 = (WeakRefDictionaryEntry<Js::DynamicType,_Memory::WriteBarrierPtr<Js::DynamicType>_> *)
             0x8;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = count;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar2 * ZEXT816(0x18),0);
    }
    pWVar3 = (WeakRefDictionaryEntry<Js::DynamicType,_Memory::WriteBarrierPtr<Js::DynamicType>_> *)
             new__<Memory::Recycler>
                       (byteSize,(Recycler *)this,(offset_in_Recycler_to_subr)allocator);
    lVar4 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(pWVar3->key).ptr + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar4 = lVar4 + 0x18;
    } while (count * 0x18 - lVar4 != 0);
  }
  return pWVar3;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}